

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void gpc_unpc(Pixel *out,Pixel *in,Background *back)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  
  if (in->a < 0x81) {
    out->r = 0xff;
    out->g = 0xff;
    uVar4 = 0;
    uVar5 = 0xff;
  }
  else {
    bVar3 = sRGB((double)in->r / (double)in->a);
    out->r = (uint)bVar3;
    bVar3 = sRGB((double)in->g / (double)in->a);
    out->g = (uint)bVar3;
    uVar1 = in->b;
    uVar2 = in->a;
    bVar3 = sRGB((double)(int)uVar1 / (double)(int)uVar2);
    uVar5 = (uint)bVar3;
    dVar6 = floor((double)in->a / 257.0 + 0.5);
    uVar4 = (int)dVar6 & 0xff;
  }
  out->b = uVar5;
  out->a = uVar4;
  return;
}

Assistant:

static void
gpc_unpc(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   if (in->a <= 128)
   {
      out->r = out->g = out->b = 255;
      out->a = 0;
   }

   else
   {
      out->r = sRGB((double)in->r / in->a);
      out->g = sRGB((double)in->g / in->a);
      out->b = sRGB((double)in->b / in->a);
      out->a = u8d(in->a / 257.);
   }
}